

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O2

REF_STATUS ref_cavity_add_tet(REF_CAVITY ref_cavity,REF_INT tet)

{
  int iVar1;
  int iVar2;
  int iVar3;
  REF_CELL pRVar4;
  REF_NODE pRVar5;
  REF_INT *pRVar6;
  REF_INT *pRVar7;
  REF_INT *pRVar8;
  uint uVar9;
  undefined8 uVar10;
  long lVar11;
  long lVar12;
  char *pcVar13;
  REF_INT already_have_it;
  REF_INT face_nodes [3];
  
  if (-1 < tet) {
    pRVar4 = ref_cavity->ref_grid->cell[8];
    if ((tet < pRVar4->max) && (pRVar4->c2n[(long)pRVar4->size_per * (long)tet] != -1)) {
      pRVar5 = ref_cavity->ref_grid->node;
      uVar9 = ref_list_contains(ref_cavity->tet_list,tet,&already_have_it);
      if (uVar9 == 0) {
        if (already_have_it != 0) {
          return 0;
        }
        uVar9 = ref_list_push(ref_cavity->tet_list,tet);
        if (uVar9 == 0) {
          lVar11 = 0;
          while( true ) {
            if (pRVar4->face_per <= lVar11) {
              return 0;
            }
            pRVar6 = pRVar4->c2n;
            iVar1 = pRVar4->size_per;
            pRVar7 = pRVar5->part;
            iVar2 = pRVar5->ref_mpi->id;
            pRVar8 = pRVar4->f2n;
            lVar12 = 0;
            while (lVar12 != 3) {
              iVar3 = pRVar6[(long)pRVar8[(ulong)((uint)lVar11 & 0x3fffffff) * 4 + lVar12] +
                             (long)iVar1 * (long)tet];
              face_nodes[lVar12] = iVar3;
              lVar12 = lVar12 + 1;
              if (iVar2 != pRVar7[iVar3]) {
                ref_cavity->state = REF_CAVITY_PARTITION_CONSTRAINED;
                return 0;
              }
            }
            uVar9 = ref_cavity_insert_face(ref_cavity,face_nodes);
            if (uVar9 != 0) break;
            lVar11 = lVar11 + 1;
            if (ref_cavity->state != REF_CAVITY_UNKNOWN) {
              return 0;
            }
          }
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 0x241,"ref_cavity_add_tet",(ulong)uVar9,"tet side");
          return uVar9;
        }
        pcVar13 = "save tet";
        uVar10 = 0x237;
      }
      else {
        pcVar13 = "have tet?";
        uVar10 = 0x234;
      }
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
             uVar10,"ref_cavity_add_tet",(ulong)uVar9,pcVar13);
      return uVar9;
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",0x231,
         "ref_cavity_add_tet","invalid tet");
  return 1;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_add_tet(REF_CAVITY ref_cavity, REF_INT tet) {
  REF_CELL ref_cell = ref_grid_tet(ref_cavity_grid(ref_cavity));
  REF_NODE ref_node = ref_grid_node(ref_cavity_grid(ref_cavity));
  REF_INT cell_face, node;
  REF_INT face_nodes[3];
  REF_INT already_have_it;

  RAS(ref_cell_valid(ref_cell, tet), "invalid tet");

  RSS(ref_list_contains(ref_cavity_tet_list(ref_cavity), tet, &already_have_it),
      "have tet?");
  if (already_have_it) return REF_SUCCESS;

  RSS(ref_list_push(ref_cavity_tet_list(ref_cavity), tet), "save tet");

  each_ref_cell_cell_face(ref_cell, cell_face) {
    each_ref_cavity_face_node(ref_cavity, node) {
      face_nodes[node] = ref_cell_f2n(ref_cell, node, cell_face, tet);
      if (!ref_node_owned(ref_node, face_nodes[node])) {
        ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
        return REF_SUCCESS;
      }
    }
    RSS(ref_cavity_insert_face(ref_cavity, face_nodes), "tet side");
    if (REF_CAVITY_UNKNOWN != ref_cavity_state(ref_cavity)) return REF_SUCCESS;
  }

  return REF_SUCCESS;
}